

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O2

void __thiscall glu::ObjectVector::~ObjectVector(ObjectVector *this)

{
  clear(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

ObjectVector::~ObjectVector (void)
{
	clear();
}